

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  string_maker<std::optional<int>> sVar1;
  optional<int> *in_RDX;
  string sStack_38;
  
  sVar1 = (*(string_maker<std::optional<int>> **)this)[4];
  string_maker<std::optional<int>>::to_string_abi_cxx11_
            (&sStack_38,*(string_maker<std::optional<int>> **)this,in_RDX);
  __return_storage_ptr__->passed = (bool)sVar1;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->decomposition,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }